

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

void __thiscall Js::FunctionBody::SetWasCalledFromLoop(FunctionBody *this)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  code *pcVar4;
  bool bVar5;
  LocalFunctionId functionId;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  undefined4 *puVar9;
  LoopHeader *pLVar10;
  long lVar11;
  uint uVar12;
  
  if ((short)*(uint *)&this->field_0x178 < 0) {
    return;
  }
  *(uint *)&this->field_0x178 = *(uint *)&this->field_0x178 | 0x8000;
  if (DAT_01441e58 == '\x01') {
    uVar2 = ((((((this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr)->
               m_srcInfo).ptr)->sourceContextInfo).ptr)->sourceContextId;
    functionId = FunctionProxy::GetLocalFunctionId((FunctionProxy *)this);
    bVar5 = Phases::IsEnabled((Phases *)&DAT_01453738,ExecutionModePhase,uVar2,functionId);
    if (bVar5) {
      FunctionExecutionStateMachine::CommitExecutedIterations(&this->executionState);
      TraceExecutionMode(this,"WasCalledFromLoop (before)");
    }
  }
  else {
    FunctionExecutionStateMachine::CommitExecutedIterations(&this->executionState);
    TraceExecutionMode(this,"WasCalledFromLoop (before)");
    uVar1 = (this->executionState).fullJitThreshold;
    if (1 < uVar1) {
      FunctionExecutionStateMachine::SetFullJitThreshold
                (&this->executionState,uVar1 >> 1,(bool)(DAT_01441e6c ^ 1));
    }
  }
  uVar2 = this->loopInterpreterLimit;
  uVar6 = GetReducedLoopInterpretCount();
  if (uVar2 < uVar6) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1c4e,"(newLoopInterpreterLimit <= oldLoopInterpreterLimit)",
                                "newLoopInterpreterLimit <= oldLoopInterpreterLimit");
    if (!bVar5) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar9 = 0;
  }
  this->loopInterpreterLimit = uVar6;
  uVar7 = GetLoopProfileThreshold(this,uVar2);
  uVar6 = GetLoopProfileThreshold(this,uVar6);
  pLVar10 = FunctionProxy::GetAuxPtr<(Js::FunctionProxy::AuxPointerType)10,Js::LoopHeader*>
                      ((FunctionProxy *)this);
  if (pLVar10 != (LoopHeader *)0x0) {
    uVar8 = GetLoopCount(this);
    for (lVar11 = 0; (ulong)uVar8 * 0x30 - lVar11 != 0; lVar11 = lVar11 + 0x30) {
      uVar3 = *(uint *)((long)&pLVar10->interpretCount + lVar11);
      if (uVar3 < uVar2 && uVar6 < uVar3) {
        uVar12 = (uVar6 - uVar7) + uVar3;
        if (uVar3 <= uVar7) {
          uVar12 = uVar6;
        }
        *(uint *)((long)&pLVar10->interpretCount + lVar11) = uVar12;
      }
    }
  }
  TraceExecutionMode(this,"WasCalledFromLoop");
  return;
}

Assistant:

void FunctionBody::SetWasCalledFromLoop()
    {
        if(wasCalledFromLoop)
        {
            return;
        }
        wasCalledFromLoop = true;

        if(Configuration::Global.flags.EnforceExecutionModeLimits)
        {
            if(PHASE_TRACE(Phase::ExecutionModePhase, this))
            {
                executionState.CommitExecutedIterations();
                TraceExecutionMode("WasCalledFromLoop (before)");
            }
        }
        else
        {
            // This function is likely going to be called frequently since it's called from a loop. Reduce the full JIT
            // threshold to realize the full JIT perf benefit sooner.
            executionState.CommitExecutedIterations();
            TraceExecutionMode("WasCalledFromLoop (before)");
            uint16 fullJitThreshold = executionState.GetFullJitThreshold();
            if(fullJitThreshold > 1)
            {
                executionState.SetFullJitThreshold(fullJitThreshold / 2, !CONFIG_FLAG(NewSimpleJit));
            }
        }

        {
            // Reduce the loop interpreter limit too, for the same reasons as above
            const uint oldLoopInterpreterLimit = GetLoopInterpreterLimit();
            const uint newLoopInterpreterLimit = GetReducedLoopInterpretCount();
            Assert(newLoopInterpreterLimit <= oldLoopInterpreterLimit);
            SetLoopInterpreterLimit(newLoopInterpreterLimit);

            // Adjust loop headers' interpret counts to ensure that loops will still be profiled a number of times before
            // loop bodies are jitted
            const uint oldLoopProfileThreshold = GetLoopProfileThreshold(oldLoopInterpreterLimit);
            const uint newLoopProfileThreshold = GetLoopProfileThreshold(newLoopInterpreterLimit);
            MapLoopHeaders([=](const uint index, LoopHeader *const loopHeader)
            {
                const uint interpretedCount = loopHeader->interpretCount;
                if(interpretedCount <= newLoopProfileThreshold || interpretedCount >= oldLoopInterpreterLimit)
                {
                    // The loop hasn't been profiled yet and wouldn't have started profiling even with the new profile
                    // threshold, or it has already been profiled the necessary minimum number of times based on the old limit
                    return;
                }

                if(interpretedCount <= oldLoopProfileThreshold)
                {
                    // The loop hasn't been profiled yet, but would have started profiling with the new profile threshold. Start
                    // profiling on the next iteration.
                    loopHeader->interpretCount = newLoopProfileThreshold;
                    return;
                }

                // The loop has been profiled some already. Preserve the number of profiled iterations.
                loopHeader->interpretCount = newLoopProfileThreshold + (interpretedCount - oldLoopProfileThreshold);
            });
        }

        TraceExecutionMode("WasCalledFromLoop");
    }